

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

void __thiscall
Units_unitsWithPrefixOutOfRange_Test::~Units_unitsWithPrefixOutOfRange_Test
          (Units_unitsWithPrefixOutOfRange_Test *this)

{
  Units_unitsWithPrefixOutOfRange_Test *this_local;
  
  ~Units_unitsWithPrefixOutOfRange_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, unitsWithPrefixOutOfRange)
{
    // int limit is 2,147,483,647

    const std::string e = "Prefix '2147483648' of a unit referencing 'second' in units 'myUnits' is out of the integer range.";

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    libcellml::ModelPtr m = libcellml::Model::create();
    m->setName("myModel");
    libcellml::ComponentPtr c = libcellml::Component::create();
    c->setName("myComponent");
    libcellml::VariablePtr v = libcellml::Variable::create();
    v->setName("myVariable");
    libcellml::UnitsPtr u = libcellml::Units::create();

    u->setName("myUnits");
    u->addUnit("second", "2147483648");
    v->setUnits(u);
    c->addVariable(v);
    m->addComponent(c);
    m->addUnits(u);

    EXPECT_FALSE(m->hasUnlinkedUnits());

    validator->validateModel(m);

    EXPECT_EQ(size_t(1), validator->issueCount());
    EXPECT_EQ(e, validator->issue(0)->description());
}